

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestRegNum64Encoding
              (CodeGenGenericContext *ctx,uchar *stream,x86Command op,
              _func_int_uchar_ptr_x86Reg_unsigned_long_long *fun)

{
  int iVar1;
  uint local_34;
  uint reg;
  uchar *start;
  _func_int_uchar_ptr_x86Reg_unsigned_long_long *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
    EMIT_OP_REG_NUM64(ctx,op,testRegs[local_34],0x1122aabbccddeeff);
    iVar1 = (*fun)(puStack_18,testRegs[local_34],0x1122aabbccddeeff);
    puStack_18 = puStack_18 + iVar1;
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestRegNum64Encoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, unsigned long long num))
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		EMIT_OP_REG_NUM64(ctx, op, testRegs[reg], 0x1122aabbccddeeffll);
		stream += fun(stream, testRegs[reg], 0x1122aabbccddeeffll);
	}

	return int(stream - start);
}